

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 *len)

{
  size_t _len;
  int iVar1;
  ulong uVar2;
  PHYSFS_sint64 PVar3;
  ulong uVar4;
  uint uVar5;
  PHYSFS_uint64 PVar6;
  int iVar7;
  uint uVar8;
  ulong _len_00;
  bool bVar9;
  ulong uVar10;
  undefined4 uVar11;
  PHYSFS_uint8 buf [256];
  undefined8 local_140;
  undefined4 local_138;
  
  uVar2 = (*io->length)(io);
  PVar3 = -1;
  if (uVar2 != 0xffffffffffffffff) {
    uVar4 = 0;
    _len_00 = 0x100;
    PVar6 = uVar2 - 0x100;
    if (uVar2 < 0x100) {
      _len_00 = uVar2;
      PVar6 = 0;
    }
    bVar9 = (long)uVar2 < 1;
    if (0 < (long)uVar2) {
      iVar7 = (int)_len_00;
      _len = (long)iVar7 - 4;
      uVar5 = iVar7 - 4;
      local_140 = (long)(int)uVar5;
      uVar8 = 1;
      if ((int)uVar5 < 1) {
        uVar8 = uVar5;
      }
      uVar10 = 0;
      uVar11 = 0;
      do {
        iVar1 = (*io->seek)(io,PVar6);
        if (iVar1 == 0) goto LAB_00116792;
        if ((int)uVar10 == 0) {
          iVar1 = __PHYSFS_readAll(io,&local_138,_len_00);
          uVar10 = _len_00;
          if (iVar1 == 0) goto LAB_00116792;
        }
        else {
          iVar1 = __PHYSFS_readAll(io,&local_138,_len);
          if (iVar1 == 0) goto LAB_00116792;
          *(undefined4 *)((long)&local_140 + (long)iVar7 + 4) = uVar11;
          uVar10 = (ulong)(uint)((int)uVar10 + (int)_len);
        }
        uVar4 = (ulong)uVar5;
        iVar1 = iVar7 + -3;
        if (4 < uVar2) {
          do {
            if ((((*(char *)((long)&local_138 + uVar4) == 'P') &&
                 (*(char *)((long)&local_138 + uVar4 + 1) == 'K')) &&
                (*(char *)((long)&local_138 + uVar4 + 2) == '\x05')) &&
               (*(char *)((long)&local_138 + uVar4 + 3) == '\x06')) goto LAB_00116783;
            iVar1 = iVar1 + -1;
            uVar4 = uVar4 - 1;
          } while (1 < iVar1);
          uVar4 = (ulong)(uVar8 - 1);
        }
        PVar6 = PVar6 - local_140;
        if ((long)PVar6 < 1) {
          PVar6 = 0;
        }
        iVar1 = (int)uVar10;
        bVar9 = 0x10014 < iVar1 || (long)uVar2 <= (long)iVar1;
        uVar11 = local_138;
      } while (0x10014 >= iVar1 && (long)uVar2 > (long)iVar1);
    }
LAB_00116783:
    if (bVar9) {
      PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
LAB_00116792:
      PVar3 = -1;
    }
    else {
      if (len != (PHYSFS_sint64 *)0x0) {
        *len = uVar2;
      }
      PVar3 = PVar6 + (long)(int)uVar4;
    }
  }
  return PVar3;
}

Assistant:

static PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io, PHYSFS_sint64 *len)
{
    PHYSFS_uint8 buf[256];
    PHYSFS_uint8 extra[4] = { 0, 0, 0, 0 };
    PHYSFS_sint32 i = 0;
    PHYSFS_sint64 filelen;
    PHYSFS_sint64 filepos;
    PHYSFS_sint32 maxread;
    PHYSFS_sint32 totalread = 0;
    int found = 0;

    filelen = io->length(io);
    BAIL_IF_ERRPASS(filelen == -1, -1);

    /*
     * Jump to the end of the file and start reading backwards.
     *  The last thing in the file is the zipfile comment, which is variable
     *  length, and the field that specifies its size is before it in the
     *  file (argh!)...this means that we need to scan backwards until we
     *  hit the end-of-central-dir signature. We can then sanity check that
     *  the comment was as big as it should be to make sure we're in the
     *  right place. The comment length field is 16 bits, so we can stop
     *  searching for that signature after a little more than 64k at most,
     *  and call it a corrupted zipfile.
     */

    if (sizeof (buf) < filelen)
    {
        filepos = filelen - sizeof (buf);
        maxread = sizeof (buf);
    } /* if */
    else
    {
        filepos = 0;
        maxread = (PHYSFS_uint32) filelen;
    } /* else */

    while ((totalread < filelen) && (totalread < 65557))
    {
        BAIL_IF_ERRPASS(!io->seek(io, filepos), -1);

        /* make sure we catch a signature between buffers. */
        if (totalread != 0)
        {
            if (!__PHYSFS_readAll(io, buf, maxread - 4))
                return -1;
            memcpy(&buf[maxread - 4], &extra, sizeof (extra));
            totalread += maxread - 4;
        } /* if */
        else
        {
            if (!__PHYSFS_readAll(io, buf, maxread))
                return -1;
            totalread += maxread;
        } /* else */

        memcpy(&extra, buf, sizeof (extra));

        for (i = maxread - 4; i > 0; i--)
        {
            if ((buf[i + 0] == 0x50) &&
                (buf[i + 1] == 0x4B) &&
                (buf[i + 2] == 0x05) &&
                (buf[i + 3] == 0x06) )
            {
                found = 1;  /* that's the signature! */
                break;  
            } /* if */
        } /* for */

        if (found)
            break;

        filepos -= (maxread - 4);
        if (filepos < 0)
            filepos = 0;
    } /* while */

    BAIL_IF(!found, PHYSFS_ERR_UNSUPPORTED, -1);

    if (len != NULL)
        *len = filelen;

    return (filepos + i);
}